

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3ColumnMethod(sqlite3_vtab_cursor *pCursor,sqlite3_context *pCtx,int iCol)

{
  sqlite3_vtab *psVar1;
  int iVar2;
  sqlite3_value *pValue;
  Fts3Table *p;
  Fts3Cursor *pCsr;
  int rc;
  int iCol_local;
  sqlite3_context *pCtx_local;
  sqlite3_vtab_cursor *pCursor_local;
  
  pCsr._0_4_ = 0;
  psVar1 = pCursor->pVtab;
  iVar2 = iCol - *(int *)&psVar1[2].pModule;
  if (iCol == *(int *)&psVar1[2].pModule) {
    sqlite3_result_pointer(pCtx,pCursor,"fts3cursor",(_func_void_void_ptr *)0x0);
  }
  else if (iVar2 == 1) {
    sqlite3_result_int64(pCtx,(i64)pCursor[6].pVtab);
  }
  else {
    pCsr._4_4_ = iCol;
    if (iVar2 == 2) {
      if (pCursor[3].pVtab != (sqlite3_vtab *)0x0) {
        sqlite3_result_int64(pCtx,(long)*(int *)&pCursor[4].pVtab);
        return 0;
      }
      if (psVar1[3].zErrMsg == (char *)0x0) {
        sqlite3_result_int(pCtx,0);
        return 0;
      }
      pCsr._4_4_ = *(int *)&psVar1[2].pModule;
    }
    pCsr._0_4_ = fts3CursorSeek((sqlite3_context *)0x0,(Fts3Cursor *)pCursor);
    if (((int)pCsr == 0) &&
       (iVar2 = sqlite3_data_count((sqlite3_stmt *)pCursor[2].pVtab), pCsr._4_4_ < iVar2 + -1)) {
      pValue = sqlite3_column_value((sqlite3_stmt *)pCursor[2].pVtab,pCsr._4_4_ + 1);
      sqlite3_result_value(pCtx,pValue);
    }
  }
  return (int)pCsr;
}

Assistant:

static int fts3ColumnMethod(
  sqlite3_vtab_cursor *pCursor,   /* Cursor to retrieve value from */
  sqlite3_context *pCtx,          /* Context for sqlite3_result_xxx() calls */
  int iCol                        /* Index of column to read value from */
){
  int rc = SQLITE_OK;             /* Return Code */
  Fts3Cursor *pCsr = (Fts3Cursor *) pCursor;
  Fts3Table *p = (Fts3Table *)pCursor->pVtab;

  /* The column value supplied by SQLite must be in range. */
  assert( iCol>=0 && iCol<=p->nColumn+2 );

  switch( iCol-p->nColumn ){
    case 0:
      /* The special 'table-name' column */
      sqlite3_result_pointer(pCtx, pCsr, "fts3cursor", 0);
      break;

    case 1:
      /* The docid column */
      sqlite3_result_int64(pCtx, pCsr->iPrevId);
      break;

    case 2:
      if( pCsr->pExpr ){
        sqlite3_result_int64(pCtx, pCsr->iLangid);
        break;
      }else if( p->zLanguageid==0 ){
        sqlite3_result_int(pCtx, 0);
        break;
      }else{
        iCol = p->nColumn;
        /* fall-through */
      }

    default:
      /* A user column. Or, if this is a full-table scan, possibly the
      ** language-id column. Seek the cursor. */
      rc = fts3CursorSeek(0, pCsr);
      if( rc==SQLITE_OK && sqlite3_data_count(pCsr->pStmt)-1>iCol ){
        sqlite3_result_value(pCtx, sqlite3_column_value(pCsr->pStmt, iCol+1));
      }
      break;
  }

  assert( ((Fts3Table *)pCsr->base.pVtab)->pSegments==0 );
  return rc;
}